

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseRAPass::useTemporaryMem
          (BaseRAPass *this,BaseMem *out,uint32_t size,uint32_t alignment)

{
  uint32_t uVar1;
  BaseCompiler *this_00;
  long lVar2;
  uint uVar3;
  Error EVar4;
  undefined8 extraout_RAX;
  
  if (alignment < 0x41) {
    uVar3 = (this->_temporaryMem).super_Operand_._signature._bits;
    if (uVar3 == 0) {
      EVar4 = BaseCompiler::_newStack
                        ((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,
                         (BaseMem *)&this->_temporaryMem,size,alignment,(char *)0x0);
      if (EVar4 != 0) {
        return EVar4;
      }
LAB_0012a636:
      uVar1 = (this->_temporaryMem).super_Operand_._baseId;
      (out->super_Operand).super_Operand_._signature =
           (Signature)(this->_temporaryMem).super_Operand_._signature._bits;
      (out->super_Operand).super_Operand_._baseId = uVar1;
      (out->super_Operand).super_Operand_._data[0] = (this->_temporaryMem).super_Operand_._data[0];
      (out->super_Operand).super_Operand_._data[1] = (this->_temporaryMem).super_Operand_._data[1];
      return 0;
    }
    if ((uVar3 >> 0xd & 1) != 0) {
      uVar1 = (this->_temporaryMem).super_Operand_._baseId;
      this_00 = (BaseCompiler *)(this->super_FuncPass).super_Pass._cb;
      uVar3 = uVar1 - 0x100;
      if (uVar3 < *(uint *)&this_00->field_0x1f0) {
        lVar2 = *(long *)(*(long *)&this_00->_vRegArray + (ulong)uVar3 * 8);
        uVar3 = *(uint *)(lVar2 + 8);
        if (size < uVar3) {
          size = uVar3;
        }
        uVar3 = (uint)*(byte *)(lVar2 + 0xc);
        if (alignment < uVar3) {
          alignment = uVar3;
        }
        BaseCompiler::setStackSize(this_00,uVar1,size,alignment);
        goto LAB_0012a636;
      }
      goto LAB_0012a681;
    }
  }
  else {
    useTemporaryMem();
  }
  useTemporaryMem();
LAB_0012a681:
  useTemporaryMem();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Error BaseRAPass::useTemporaryMem(BaseMem& out, uint32_t size, uint32_t alignment) noexcept {
  ASMJIT_ASSERT(alignment <= 64);

  if (_temporaryMem.isNone()) {
    ASMJIT_PROPAGATE(cc()->_newStack(&_temporaryMem.as<BaseMem>(), size, alignment));
  }
  else {
    ASMJIT_ASSERT(_temporaryMem.as<BaseMem>().isRegHome());

    uint32_t virtId = _temporaryMem.as<BaseMem>().baseId();
    VirtReg* virtReg = cc()->virtRegById(virtId);

    cc()->setStackSize(virtId, Support::max(virtReg->virtSize(), size),
                               Support::max(virtReg->alignment(), alignment));
  }

  out = _temporaryMem.as<BaseMem>();
  return kErrorOk;
}